

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void testing::internal::JsonUnitTestResultPrinter::OutputJsonTestInfo
               (ostream *stream,char *test_suite_name,TestInfo *test_info)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  size_t sVar5;
  TestPartResult *pTVar6;
  long *plVar7;
  string *value;
  TimeInMillis ms;
  TimeInMillis ms_00;
  int iVar8;
  int i;
  _Alloc_hider _Var9;
  char *pcVar10;
  internal *this;
  TestResult *pTVar11;
  string location;
  string message;
  string kIndent;
  string kTestsuite;
  string local_100;
  string local_e0;
  string local_c0;
  string local_a0;
  undefined1 local_80 [32];
  TestResult *local_60;
  char *local_58;
  long *local_50 [2];
  long local_40 [2];
  
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  local_58 = test_suite_name;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"testcase","");
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_c0,'\n');
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_100,'\b');
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (stream,local_100._M_dataplus._M_p,local_100._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"{\n",2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"name","");
  std::__cxx11::string::string
            ((string *)&local_e0,(test_info->name_)._M_dataplus._M_p,(allocator *)local_80);
  OutputJsonKey(stream,&local_a0,&local_100,&local_e0,&local_c0,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  pbVar1 = (test_info->value_param_)._M_t.
           super___uniq_ptr_impl<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
  if ((pbVar1 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
     ((pbVar1->_M_dataplus)._M_p != (pointer)0x0)) {
    local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"value_param","");
    pbVar1 = (test_info->value_param_)._M_t.
             super___uniq_ptr_impl<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl;
    if (pbVar1 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      _Var9._M_p = (char *)0x0;
    }
    else {
      _Var9._M_p = (pbVar1->_M_dataplus)._M_p;
    }
    std::__cxx11::string::string((string *)&local_e0,_Var9._M_p,(allocator *)local_80);
    OutputJsonKey(stream,&local_a0,&local_100,&local_e0,&local_c0,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    }
  }
  pbVar1 = (test_info->type_param_)._M_t.
           super___uniq_ptr_impl<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
  if ((pbVar1 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
     ((pbVar1->_M_dataplus)._M_p != (pointer)0x0)) {
    local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"type_param","");
    pbVar1 = (test_info->type_param_)._M_t.
             super___uniq_ptr_impl<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl;
    if (pbVar1 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      _Var9._M_p = (char *)0x0;
    }
    else {
      _Var9._M_p = (pbVar1->_M_dataplus)._M_p;
    }
    std::__cxx11::string::string((string *)&local_e0,_Var9._M_p,(allocator *)local_80);
    OutputJsonKey(stream,&local_a0,&local_100,&local_e0,&local_c0,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    }
  }
  if (FLAGS_gtest_list_tests == '\x01') {
    local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"file","");
    std::__cxx11::string::string
              ((string *)&local_e0,(test_info->location_).file._M_dataplus._M_p,
               (allocator *)local_80);
    OutputJsonKey(stream,&local_a0,&local_100,&local_e0,&local_c0,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    }
    local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"line","");
    OutputJsonKey(stream,&local_a0,&local_100,(test_info->location_).line,&local_c0,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>(stream,"\n",1);
    local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_100,'\b');
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (stream,local_100._M_dataplus._M_p,local_100._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"}",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"status","");
    pcVar10 = "NOTRUN";
    if ((ulong)test_info->should_run_ != 0) {
      pcVar10 = "RUN";
    }
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e0,pcVar10,pcVar10 + ((ulong)test_info->should_run_ ^ 1) * 3 + 3);
    OutputJsonKey(stream,&local_a0,&local_100,&local_e0,&local_c0,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    }
    pTVar11 = &test_info->result_;
    local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"result","");
    local_60 = pTVar11;
    if (test_info->should_run_ == true) {
      bVar2 = TestResult::Skipped(pTVar11);
      pcVar10 = "COMPLETED";
      if (bVar2) {
        pcVar10 = "SKIPPED";
      }
    }
    else {
      pcVar10 = "SUPPRESSED";
    }
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    sVar5 = strlen(pcVar10);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,pcVar10,pcVar10 + sVar5);
    OutputJsonKey(stream,&local_a0,&local_100,&local_e0,&local_c0,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    }
    local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"timestamp","");
    FormatEpochTimeInMillisAsRFC3339_abi_cxx11_
              (&local_e0,(internal *)(test_info->result_).start_timestamp_,ms);
    OutputJsonKey(stream,&local_a0,&local_100,&local_e0,&local_c0,true);
    pTVar11 = local_60;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    }
    local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"time","");
    FormatTimeInMillisAsDuration_abi_cxx11_
              (&local_e0,(internal *)(test_info->result_).elapsed_time_,ms_00);
    OutputJsonKey(stream,&local_a0,&local_100,&local_e0,&local_c0,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    }
    local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"classname","");
    value = &local_e0;
    std::__cxx11::string::string((string *)value,local_58,(allocator *)local_80);
    OutputJsonKey(stream,&local_a0,&local_100,value,&local_c0,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    }
    TestPropertiesAsJson(&local_100,pTVar11,&local_c0);
    std::__ostream_insert<char,std::char_traits<char>>
              (stream,local_100._M_dataplus._M_p,local_100._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    }
    if (0 < (int)((ulong)((long)(test_info->result_).test_part_results_.
                                super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(test_info->result_).test_part_results_.
                               super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x49249249) {
      i = 0;
      iVar8 = 0;
      do {
        pTVar6 = TestResult::GetTestPartResult(pTVar11,i);
        iVar3 = (int)value;
        if (pTVar6->type_ - kNonFatalFailure < 2) {
          std::__ostream_insert<char,std::char_traits<char>>(stream,",\n",2);
          if (iVar8 == 0) {
            poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                               (stream,local_c0._M_dataplus._M_p,local_c0._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\"",1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,"failures",8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\": [\n",5);
          }
          this = (internal *)(pTVar6->file_name_)._M_string_length;
          if (this != (internal *)0x0) {
            this = (internal *)(pTVar6->file_name_)._M_dataplus._M_p;
          }
          FormatCompilerIndependentFileLocation_abi_cxx11_
                    (&local_100,this,(char *)(ulong)(uint)pTVar6->line_number_,iVar3);
          local_50[0] = local_40;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_50,local_100._M_dataplus._M_p,
                     local_100._M_dataplus._M_p + local_100._M_string_length);
          std::__cxx11::string::append((char *)local_50);
          plVar7 = (long *)std::__cxx11::string::append((char *)local_50);
          value = (string *)(plVar7 + 2);
          if ((string *)*plVar7 == value) {
            local_80._16_8_ = (value->_M_dataplus)._M_p;
            local_80._24_8_ = plVar7[3];
            local_80._0_8_ = (string *)(local_80 + 0x10);
          }
          else {
            local_80._16_8_ = (value->_M_dataplus)._M_p;
            local_80._0_8_ = (string *)*plVar7;
          }
          local_80._8_8_ = plVar7[1];
          *plVar7 = (long)value;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          EscapeJson(&local_e0,(string *)local_80);
          if ((string *)local_80._0_8_ != (string *)(local_80 + 0x10)) {
            operator_delete((void *)local_80._0_8_,(ulong)(local_80._16_8_ + 1));
          }
          if (local_50[0] != local_40) {
            operator_delete(local_50[0],local_40[0] + 1);
          }
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             (stream,local_c0._M_dataplus._M_p,local_c0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  {\n",4);
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar4,local_c0._M_dataplus._M_p,local_c0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"    \"failure\": \"",0x10);
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar4,local_e0._M_dataplus._M_p,local_e0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\",\n",3);
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar4,local_c0._M_dataplus._M_p,local_c0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"    \"type\": \"\"\n",0xf);
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar4,local_c0._M_dataplus._M_p,local_c0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  }",3);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
            operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
          }
          pTVar11 = local_60;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_100._M_dataplus._M_p != &local_100.field_2) {
            operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
          }
          iVar8 = iVar8 + 1;
        }
        i = i + 1;
        iVar3 = (int)((ulong)((long)(test_info->result_).test_part_results_.
                                    super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(test_info->result_).test_part_results_.
                                   super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 4);
      } while (SBORROW4(i,iVar3 * -0x49249249) != i + iVar3 * 0x49249249 < 0);
      if (0 < iVar8) {
        std::__ostream_insert<char,std::char_traits<char>>(stream,"\n",1);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (stream,local_c0._M_dataplus._M_p,local_c0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"]",1);
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>(stream,"\n",1);
    local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_100,'\b');
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (stream,local_100._M_dataplus._M_p,local_100._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"}",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void JsonUnitTestResultPrinter::OutputJsonTestInfo(::std::ostream* stream,
                                                   const char* test_suite_name,
                                                   const TestInfo& test_info) {
  const TestResult& result = *test_info.result();
  const std::string kTestsuite = "testcase";
  const std::string kIndent = Indent(10);

  *stream << Indent(8) << "{\n";
  OutputJsonKey(stream, kTestsuite, "name", test_info.name(), kIndent);

  if (test_info.value_param() != nullptr) {
    OutputJsonKey(stream, kTestsuite, "value_param", test_info.value_param(),
                  kIndent);
  }
  if (test_info.type_param() != nullptr) {
    OutputJsonKey(stream, kTestsuite, "type_param", test_info.type_param(),
                  kIndent);
  }
  if (GTEST_FLAG(list_tests)) {
    OutputJsonKey(stream, kTestsuite, "file", test_info.file(), kIndent);
    OutputJsonKey(stream, kTestsuite, "line", test_info.line(), kIndent, false);
    *stream << "\n" << Indent(8) << "}";
    return;
  }

  OutputJsonKey(stream, kTestsuite, "status",
                test_info.should_run() ? "RUN" : "NOTRUN", kIndent);
  OutputJsonKey(stream, kTestsuite, "result",
                test_info.should_run()
                    ? (result.Skipped() ? "SKIPPED" : "COMPLETED")
                    : "SUPPRESSED",
                kIndent);
  OutputJsonKey(stream, kTestsuite, "timestamp",
                FormatEpochTimeInMillisAsRFC3339(result.start_timestamp()),
                kIndent);
  OutputJsonKey(stream, kTestsuite, "time",
                FormatTimeInMillisAsDuration(result.elapsed_time()), kIndent);
  OutputJsonKey(stream, kTestsuite, "classname", test_suite_name, kIndent,
                false);
  *stream << TestPropertiesAsJson(result, kIndent);

  int failures = 0;
  for (int i = 0; i < result.total_part_count(); ++i) {
    const TestPartResult& part = result.GetTestPartResult(i);
    if (part.failed()) {
      *stream << ",\n";
      if (++failures == 1) {
        *stream << kIndent << "\"" << "failures" << "\": [\n";
      }
      const std::string location =
          internal::FormatCompilerIndependentFileLocation(part.file_name(),
                                                          part.line_number());
      const std::string message = EscapeJson(location + "\n" + part.message());
      *stream << kIndent << "  {\n"
              << kIndent << "    \"failure\": \"" << message << "\",\n"
              << kIndent << "    \"type\": \"\"\n"
              << kIndent << "  }";
    }
  }

  if (failures > 0)
    *stream << "\n" << kIndent << "]";
  *stream << "\n" << Indent(8) << "}";
}